

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint auto_choose_color(LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,LodePNGColorStats *stats
                      )

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  LodePNGColorType LVar5;
  uint uVar6;
  LodePNGColorType LVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  uVar8 = stats->numpixels;
  uVar3 = stats->key;
  uVar2 = stats->alpha;
  uVar1 = stats->bits;
  mode_out->key_defined = 0;
  uVar6 = 8;
  if (8 < uVar1) {
    uVar6 = uVar1;
  }
  if (uVar8 >= 0x11 || uVar3 == 0) {
    uVar6 = uVar1;
  }
  uVar1 = stats->numcolors;
  bVar9 = stats->colored == 0;
  bVar10 = stats->allow_greyscale != 0;
  uVar4 = 8;
  if (7 < uVar6) {
    uVar4 = uVar6;
  }
  if (bVar10 && bVar9) {
    uVar4 = uVar6;
  }
  if ((ulong)uVar1 < 3) {
    uVar6 = 1;
  }
  else if (uVar1 < 5) {
    uVar6 = 2;
  }
  else {
    uVar6 = (uint)(0x10 < uVar1) * 4 + 4;
  }
  if ((((stats->allow_palette == 0) || (uVar4 <= uVar6 && (bVar10 && bVar9))) ||
      (uVar1 - 0x101 < 0xffffff00)) || ((uVar8 < (ulong)uVar1 * 2 || (8 < uVar4)))) {
    mode_out->bitdepth = uVar4;
    bVar9 = !bVar10 || !bVar9;
    LVar5 = bVar9 + 4 + (uint)bVar9;
    LVar7 = (uint)bVar9 + (uint)bVar9;
    if (uVar2 != 0) {
      LVar7 = LVar5;
    }
    if (uVar8 < 0x11 && uVar3 != 0) {
      LVar7 = LVar5;
    }
    mode_out->colortype = LVar7;
    uVar2 = 0;
    if (uVar3 != 0 && 0x10 < uVar8) {
      uVar3 = ~(-1 << ((byte)uVar4 & 0x1f));
      mode_out->key_r = stats->key_r & uVar3;
      mode_out->key_g = stats->key_g & uVar3;
      mode_out->key_b = stats->key_b & uVar3;
      mode_out->key_defined = 1;
    }
  }
  else {
    lodepng_palette_clear(mode_out);
    uVar8 = 0;
    do {
      uVar2 = 0;
      if (uVar8 == stats->numcolors) break;
      uVar2 = lodepng_palette_add(mode_out,stats->palette[uVar8 * 4],stats->palette[uVar8 * 4 + 1],
                                  stats->palette[uVar8 * 4 + 2],stats->palette[uVar8 * 4 + 3]);
      uVar8 = uVar8 + 1;
    } while (uVar2 == 0);
    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = uVar6;
    if (((mode_in->colortype == LCT_PALETTE) && (mode_out->palettesize <= mode_in->palettesize)) &&
       (mode_in->bitdepth == uVar6)) {
      lodepng_palette_clear(mode_out);
      lodepng_color_mode_copy(mode_out,mode_in);
    }
  }
  return uVar2;
}

Assistant:

unsigned auto_choose_color(LodePNGColorMode* mode_out,
                           const LodePNGColorMode* mode_in,
                           const LodePNGColorStats* stats) {
  unsigned error = 0;
  unsigned palettebits;
  size_t i, n;
  size_t numpixels = stats->numpixels;
  unsigned palette_ok, gray_ok;

  unsigned alpha = stats->alpha;
  unsigned key = stats->key;
  unsigned bits = stats->bits;

  mode_out->key_defined = 0;

  if(key && numpixels <= 16) {
    alpha = 1; /*too few pixels to justify tRNS chunk overhead*/
    key = 0;
    if(bits < 8) bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
  }

  gray_ok = !stats->colored;
  if(!stats->allow_greyscale) gray_ok = 0;
  if(!gray_ok && bits < 8) bits = 8;

  n = stats->numcolors;
  palettebits = n <= 2 ? 1 : (n <= 4 ? 2 : (n <= 16 ? 4 : 8));
  palette_ok = n <= 256 && bits <= 8 && n != 0; /*n==0 means likely numcolors wasn't computed*/
  if(numpixels < n * 2) palette_ok = 0; /*don't add palette overhead if image has only a few pixels*/
  if(gray_ok && bits <= palettebits) palette_ok = 0; /*gray is less overhead*/
  if(!stats->allow_palette) palette_ok = 0;

  if(palette_ok) {
    const unsigned char* p = stats->palette;
    lodepng_palette_clear(mode_out); /*remove potential earlier palette*/
    for(i = 0; i != stats->numcolors; ++i) {
      error = lodepng_palette_add(mode_out, p[i * 4 + 0], p[i * 4 + 1], p[i * 4 + 2], p[i * 4 + 3]);
      if(error) break;
    }

    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = palettebits;

    if(mode_in->colortype == LCT_PALETTE && mode_in->palettesize >= mode_out->palettesize
        && mode_in->bitdepth == mode_out->bitdepth) {
      /*If input should have same palette colors, keep original to preserve its order and prevent conversion*/
      lodepng_color_mode_cleanup(mode_out);
      lodepng_color_mode_copy(mode_out, mode_in);
    }
  } else /*8-bit or 16-bit per channel*/ {
    mode_out->bitdepth = bits;
    mode_out->colortype = alpha ? (gray_ok ? LCT_GREY_ALPHA : LCT_RGBA)
                                : (gray_ok ? LCT_GREY : LCT_RGB);
    if(key) {
      unsigned mask = (1u << mode_out->bitdepth) - 1u; /*stats always uses 16-bit, mask converts it*/
      mode_out->key_r = stats->key_r & mask;
      mode_out->key_g = stats->key_g & mask;
      mode_out->key_b = stats->key_b & mask;
      mode_out->key_defined = 1;
    }
  }

  return error;
}